

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O1

int __thiscall yyFlexLexer::LexerInput(yyFlexLexer *this,char *buf,int param_2)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((&this->field_0x50)[*(long *)(*(long *)&this->yyin + -0x18)] & 7) == 0) {
    std::istream::get((char *)&this->yyin);
    uVar1 = 0;
    if ((*(uint *)(&this->field_0x50 + *(long *)(*(long *)&this->yyin + -0x18)) & 2) == 0) {
      uVar1 = -(*(uint *)(&this->field_0x50 + *(long *)(*(long *)&this->yyin + -0x18)) & 1) | 1;
    }
  }
  return uVar1;
}

Assistant:

int yyFlexLexer::LexerInput( char* buf, int max_size )
#endif
{
	if ( yyin.eof() || yyin.fail() )
		return 0;

#ifdef YY_INTERACTIVE
	yyin.get( buf[0] );

	if ( yyin.eof() )
		return 0;

	if ( yyin.bad() )
		return -1;

	return 1;

#else
	(void) yyin.read( buf, max_size );

	if ( yyin.bad() )
		return -1;
	else
		return yyin.gcount();
#endif
}